

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O0

char __thiscall
duckdb::QuantileSortTree::WindowScalar<signed_char,signed_char,true>
          (QuantileSortTree *this,QuantileCursor<signed_char> *data,SubFrames *frames,idx_t n,
          Vector *result,QuantileValue *q)

{
  char cVar1;
  Vector *result_00;
  CURSOR *in_RSI;
  undefined8 in_RDI;
  ID indirect;
  idx_t hi_data;
  idx_t lo_data;
  Interpolator<true> interp;
  QuantileIndirect<signed_char> in_stack_ffffffffffffff90;
  QuantileValue *in_stack_ffffffffffffff98;
  Interpolator<true> *in_stack_ffffffffffffffa0;
  Vector *hidx;
  unsigned_long in_stack_ffffffffffffffa8;
  Interpolator<true> *in_stack_ffffffffffffffb0;
  Interpolator<true> *local_48;
  
  unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>,_true>::
  operator->((unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>,_true>
              *)in_stack_ffffffffffffff90.data);
  duckdb::WindowMergeSortTree::Build();
  Interpolator<true>::Interpolator
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
             (idx_t)in_stack_ffffffffffffff90.data,SUB81((ulong)in_RDI >> 0x38,0));
  result_00 = (Vector *)
              SelectNth((QuantileSortTree *)in_stack_ffffffffffffffa0,
                        (SubFrames *)in_stack_ffffffffffffff98,
                        (size_t)in_stack_ffffffffffffff90.data);
  hidx = result_00;
  if (local_48 != in_stack_ffffffffffffffb0) {
    result_00 = (Vector *)
                SelectNth((QuantileSortTree *)result_00,(SubFrames *)result_00,
                          (size_t)in_stack_ffffffffffffff90.data);
  }
  QuantileIndirect<signed_char>::QuantileIndirect
            ((QuantileIndirect<signed_char> *)&stack0xffffffffffffff90,in_RSI);
  cVar1 = Interpolator<true>::
          Interpolate<unsigned_long,signed_char,duckdb::QuantileIndirect<signed_char>>
                    (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(unsigned_long)hidx,
                     result_00,(QuantileIndirect<signed_char> *)in_stack_ffffffffffffff90.data);
  return cVar1;
}

Assistant:

RESULT_TYPE WindowScalar(QuantileCursor<INPUT_TYPE> &data, const SubFrames &frames, const idx_t n, Vector &result,
	                         const QuantileValue &q) {
		D_ASSERT(n > 0);

		//	Thread safe and idempotent.
		index_tree->Build();

		//	Find the interpolated indicies within the frame
		Interpolator<DISCRETE> interp(q, n, false);
		const auto lo_data = SelectNth(frames, interp.FRN);
		auto hi_data = lo_data;
		if (interp.CRN != interp.FRN) {
			hi_data = SelectNth(frames, interp.CRN);
		}

		//	Interpolate indirectly
		using ID = QuantileIndirect<INPUT_TYPE>;
		ID indirect(data);
		return interp.template Interpolate<idx_t, RESULT_TYPE, ID>(lo_data, hi_data, result, indirect);
	}